

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

uint64_t ShannonEntropy_C(uint32_t *X,int n)

{
  int iVar1;
  uint64_t uVar2;
  int in_ESI;
  long in_RDI;
  int x;
  uint32_t sumX;
  uint64_t retval;
  int i;
  uint32_t v;
  undefined8 local_18;
  undefined4 local_10;
  
  local_18 = 0;
  v = 0;
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    iVar1 = *(int *)(in_RDI + (long)local_10 * 4);
    if (iVar1 != 0) {
      v = iVar1 + v;
      uVar2 = VP8LFastSLog2(v);
      local_18 = uVar2 + local_18;
    }
  }
  uVar2 = VP8LFastSLog2(v);
  return uVar2 - local_18;
}

Assistant:

static uint64_t ShannonEntropy_C(const uint32_t* X, int n) {
  int i;
  uint64_t retval = 0;
  uint32_t sumX = 0;
  for (i = 0; i < n; ++i) {
    const int x = X[i];
    if (x != 0) {
      sumX += x;
      retval += VP8LFastSLog2(x);
    }
  }
  retval = VP8LFastSLog2(sumX) - retval;
  return retval;
}